

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedList.c
# Opt level: O1

void rmlLinkedListDestroy(void *self)

{
  long lVar1;
  rmlLinkedList *selfList;
  
  lVar1 = *(long *)((long)self + 0x10);
  while (lVar1 != 0) {
    if (*(void **)((long)self + 8) != (void *)0x0) {
      rmlLinkedListRemoveItem(self,*(void **)((long)self + 8));
    }
    lVar1 = *(long *)((long)self + 0x10);
  }
  *(undefined8 *)self = 0;
  *(undefined8 *)((long)self + 8) = 0;
  *(undefined8 *)((long)self + 0x10) = 0;
  free(self);
  return;
}

Assistant:

void rmlLinkedListDestroy(void *self) {
    struct rmlLinkedList *m = self;

    while (rmlLinkedListGetLength(self)) {
        rmlLinkedListPop(self);
    }

    rmlLinkedListReset(self);
    RML_VERBOSE("Destroy LinkedList(0x%llx)", (uint64_t) m)
    free(m);
}